

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

null_terminating_iterator<wchar_t> __thiscall
fmt::v5::internal::
parse_arg_id<fmt::v5::internal::null_terminating_iterator<wchar_t>,fmt::v5::internal::id_adapter<fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>,wchar_t,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>&,wchar_t>>
          (internal *this,null_terminating_iterator<wchar_t> it,
          id_adapter<fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>,_wchar_t,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>_&,_wchar_t>
          *handler)

{
  int iVar1;
  long lVar2;
  wchar_t *pwVar3;
  uint uVar4;
  internal *piVar5;
  internal *piVar6;
  internal *piVar7;
  basic_string_view<wchar_t> name;
  null_terminating_iterator<wchar_t> nVar8;
  anon_union_16_11_26d04ec8_for_value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>_1
  local_48;
  undefined4 local_38;
  
  pwVar3 = it.end_;
  piVar5 = (internal *)it.ptr_;
  if (this == piVar5) {
    uVar4 = 0;
  }
  else {
    uVar4 = *(uint *)this;
  }
  if ((uVar4 == 0x7d) || (uVar4 == 0x3a)) {
    lVar2 = *(long *)pwVar3;
    basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>
    ::next_arg((format_arg *)&local_48.string,
               (basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>
                *)(lVar2 + 8));
    *(undefined4 *)(lVar2 + 0x60) = local_38;
    *(longlong *)(lVar2 + 0x50) = local_48.long_long_value;
    *(size_t *)(lVar2 + 0x58) = local_48.string.size;
    piVar7 = this;
  }
  else if (uVar4 - 0x30 < 10) {
    uVar4 = 0;
    piVar6 = this + 4;
    do {
      piVar7 = piVar6;
      if (piVar7 + -4 == piVar5) {
        iVar1 = -0x30;
      }
      else {
        iVar1 = *(uint *)(piVar7 + -4) - 0x30;
      }
      uVar4 = uVar4 * 10 + iVar1;
      if ((piVar7 == piVar5) || (9 < *(uint *)piVar7 - 0x30)) goto LAB_00120241;
      piVar6 = piVar7 + 4;
    } while (uVar4 < 0xccccccd);
    uVar4 = 0x80000000;
LAB_00120241:
    if ((int)uVar4 < 0) {
      error_handler::on_error((error_handler *)this,"number is too big");
    }
    if ((piVar7 == piVar5) ||
       ((*(uint *)piVar7 != 0x7d && ((piVar7 == piVar5 || (*(uint *)piVar7 != 0x3a)))))) {
LAB_001202f2:
      error_handler::on_error((error_handler *)this,"invalid format string");
    }
    format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>,_wchar_t,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
    ::on_arg_id(*(format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>,_wchar_t,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
                  **)pwVar3,uVar4);
  }
  else {
    if ((uVar4 != 0x5f) && (0x19 < (uVar4 & 0xffffffdf) - 0x41)) goto LAB_001202f2;
    lVar2 = 0;
    piVar6 = this + 4;
    do {
      piVar7 = piVar6;
      uVar4 = 0;
      if (piVar7 != piVar5) {
        uVar4 = *(uint *)piVar7;
      }
      piVar6 = piVar7 + 4;
      lVar2 = lVar2 + 4;
    } while (((uVar4 - 0x30 < 10) || (uVar4 == 0x5f)) || ((uVar4 & 0xffffffdf) - 0x41 < 0x1a));
    name.size_ = lVar2 >> 2;
    lVar2 = *(long *)pwVar3;
    name.data_ = (wchar_t *)this;
    basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>
    ::get_arg((format_arg *)&local_48.string,
              (basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>
               *)(lVar2 + 8),name);
    *(undefined4 *)(lVar2 + 0x60) = local_38;
    *(longlong *)(lVar2 + 0x50) = local_48.long_long_value;
    *(size_t *)(lVar2 + 0x58) = local_48.string.size;
  }
  nVar8.end_ = (wchar_t *)piVar5;
  nVar8.ptr_ = (wchar_t *)piVar7;
  return nVar8;
}

Assistant:

FMT_CONSTEXPR Iterator parse_arg_id(Iterator it, IDHandler &&handler) {
  typedef typename std::iterator_traits<Iterator>::value_type char_type;
  char_type c = *it;
  if (c == '}' || c == ':') {
    handler();
    return it;
  }
  if (c >= '0' && c <= '9') {
    unsigned index = parse_nonnegative_int(it, handler);
    if (*it != '}' && *it != ':') {
      handler.on_error("invalid format string");
      return it;
    }
    handler(index);
    return it;
  }
  if (!is_name_start(c)) {
    handler.on_error("invalid format string");
    return it;
  }
  auto start = it;
  do {
    c = *++it;
  } while (is_name_start(c) || ('0' <= c && c <= '9'));
  handler(basic_string_view<char_type>(pointer_from(start), to_unsigned(it - start)));
  return it;
}